

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context *s_00;
  FILE *in_RDI;
  long pos;
  stbi__context s;
  int r;
  FILE *in_stack_fffffffffffffee8;
  stbi__context *in_stack_fffffffffffffef8;
  int local_4;
  
  s_00 = (stbi__context *)ftell(in_RDI);
  stbi__start_file(s_00,in_stack_fffffffffffffee8);
  local_4 = stbi__info_main(in_stack_fffffffffffffef8,(int *)s_00,(int *)in_stack_fffffffffffffee8,
                            (int *)0x1021cd);
  if ((-1 < (long)s_00) && (iVar1 = fseek(in_RDI,(long)s_00,0), iVar1 == -1)) {
    local_4 = stbi__err("fseek() error");
  }
  return local_4;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   if (pos >= 0) {
      if (fseek(f,pos,SEEK_SET) == -1) return stbi__err("fseek() error", "File Seek Fail");
   }
   return r;
}